

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O0

void __thiscall gv_visitor::visit(gv_visitor *this,MoreThanOneExpression *ptr)

{
  Expr *second;
  bool bVar1;
  vector<Expr_*,_std::allocator<Expr_*>_> *this_00;
  reference ppEVar2;
  Expr *i;
  iterator __end1;
  iterator __begin1;
  vector<Expr_*,_std::allocator<Expr_*>_> *__range1;
  allocator<char> local_39;
  string local_38;
  MoreThanOneExpression *local_18;
  MoreThanOneExpression *ptr_local;
  gv_visitor *this_local;
  
  local_18 = ptr;
  ptr_local = (MoreThanOneExpression *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"mnogo expr",&local_39);
  box(this,ptr,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  this_00 = &(local_18->super_Expressions).exprs;
  __end1 = std::vector<Expr_*,_std::allocator<Expr_*>_>::begin(this_00);
  i = (Expr *)std::vector<Expr_*,_std::allocator<Expr_*>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>
                                *)&i);
    if (!bVar1) break;
    ppEVar2 = __gnu_cxx::__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>::
              operator*(&__end1);
    second = *ppEVar2;
    arrow(this,local_18,second);
    (**(second->super_Base)._vptr_Base)(second,this);
    __gnu_cxx::__normal_iterator<Expr_**,_std::vector<Expr_*,_std::allocator<Expr_*>_>_>::operator++
              (&__end1);
  }
  return;
}

Assistant:

void gv_visitor::visit(MoreThanOneExpression* ptr) {
    box(ptr, "mnogo expr");
    for(auto i: ptr->exprs) {
        arrow(ptr, i);
        i->accept(this);
    }
}